

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::FinalizeGCM
          (AESStateMBEDTLS *this,data_ptr_t tag,idx_t tag_len)

{
  int iVar1;
  undefined8 uVar2;
  uchar *in_RDI;
  string *in_stack_ffffffffffffff48;
  InvalidInputException *in_stack_ffffffffffffff50;
  mbedtls_cipher_context_t *in_stack_ffffffffffffff58;
  allocator *paVar3;
  size_t in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  allocator in_stack_ffffffffffffff7f;
  string local_80 [4];
  int in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  InternalException *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [32];
  runtime_error local_28 [40];
  
  iVar1 = *(int *)(in_RDI + 8);
  if (iVar1 == 0) {
    std::unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>::get
              ((unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                *)in_stack_ffffffffffffff50);
    iVar1 = mbedtls_cipher_write_tag
                      (in_stack_ffffffffffffff58,(uchar *)in_stack_ffffffffffffff50,
                       (size_t)in_stack_ffffffffffffff48);
    if (iVar1 != 0) {
      std::runtime_error::runtime_error(local_28,"Writing tag failed");
      std::runtime_error::~runtime_error(local_28);
    }
  }
  else {
    if (iVar1 != 1) {
      uVar2 = __cxa_allocate_exception(0x10);
      paVar3 = (allocator *)&stack0xffffffffffffff7f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,"Unhandled encryption mode %d",paVar3);
      duckdb::InternalException::InternalException<int>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      __cxa_throw(uVar2,&duckdb::InternalException::typeinfo,
                  duckdb::InternalException::~InternalException);
    }
    std::unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>::get
              ((unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                *)in_stack_ffffffffffffff50);
    iVar1 = mbedtls_cipher_check_tag
                      ((mbedtls_cipher_context_t *)
                       CONCAT17(in_stack_ffffffffffffff7f,
                                CONCAT16(in_stack_ffffffffffffff7e,
                                         CONCAT24(in_stack_ffffffffffffff7c,iVar1))),in_RDI,
                       in_stack_ffffffffffffff68);
    if (iVar1 != 0) {
      uVar2 = __cxa_allocate_exception(0x10);
      paVar3 = &local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_48,"Computed AES tag differs from read AES tag, are you using the right key?"
                 ,paVar3);
      duckdb::InvalidInputException::InvalidInputException
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      __cxa_throw(uVar2,&duckdb::InvalidInputException::typeinfo,
                  duckdb::InvalidInputException::~InvalidInputException);
    }
  }
  return;
}

Assistant:

void MbedTlsWrapper::AESStateMBEDTLS::FinalizeGCM(duckdb::data_ptr_t tag, duckdb::idx_t tag_len){

	switch (mode) {

	case ENCRYPT: {
		if (mbedtls_cipher_write_tag(context.get(), tag, tag_len) != 0) {
			runtime_error("Writing tag failed");
		}
		break;
	}

	case DECRYPT: {
		if (mbedtls_cipher_check_tag(context.get(), tag, tag_len) != 0) {
			throw duckdb::InvalidInputException(
			    "Computed AES tag differs from read AES tag, are you using the right key?");
		}
		break;
	}

	default:
		throw duckdb::InternalException("Unhandled encryption mode %d", static_cast<int>(mode));
	}
}